

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O0

_Bool borg_allow_teleport(void)

{
  _Bool _Var1;
  _Bool local_9;
  
  if ((player->upkeep->arena_level & 1U) == 0) {
    _Var1 = square_isno_teleport((chunk *)cave,(loc_conflict)borg.c);
    if (_Var1) {
      local_9 = false;
    }
    else if (borg.trait[0xac] == 0) {
      local_9 = true;
    }
    else {
      local_9 = false;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool borg_allow_teleport(void)
{
    /* No teleporting in arena levels */
    if (player->upkeep->arena_level)
        return false;

    /* Check for a no teleport grid */
    if (square_isno_teleport(cave, borg.c))
        return false;

    /* Check for a no teleport curse */
    if (borg.trait[BI_CRSNOTEL])
        return false;

    return true;
}